

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferViewGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::BufferViewGLImpl::BufferViewGLImpl
          (BufferViewGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
          GLContextState *CtxState,BufferViewDesc *ViewDesc,BufferGLImpl *pBuffer,
          bool bIsDefaultView)

{
  GLTextureObj *this_00;
  VALUE_TYPE ValType;
  GLenum GVar1;
  GLenum err;
  GLuint local_40;
  GLTextureObj local_3c;
  
  BufferViewBase<Diligent::EngineGLImplTraits>::BufferViewBase
            (&this->super_BufferViewBase<Diligent::EngineGLImplTraits>,pRefCounters,pDevice,ViewDesc
             ,(IBuffer *)pBuffer,bIsDefaultView,false);
  (this->super_BufferViewBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
  .super_ObjectBase<Diligent::IBufferViewGL>.super_RefCountedObject<Diligent::IBufferViewGL>.
  super_IBufferViewGL.super_IBufferView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_0041f9a8;
  (this->m_GLTexBuffer).m_uiHandle = 0;
  (this->m_GLTexBuffer).m_CreateReleaseHelper = 0;
  (this->m_GLTexBuffer).m_UniqueId.m_ID = 0;
  if (((byte)(ViewDesc->ViewType - BUFFER_VIEW_SHADER_RESOURCE) < 2) &&
     (((pBuffer->super_BufferBase<Diligent::EngineGLImplTraits>).
       super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
       .m_Desc.Mode | BUFFER_MODE_STRUCTURED) == BUFFER_MODE_RAW)) {
    this_00 = &this->m_GLTexBuffer;
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Create(this_00);
    GLContextState::BindTexture(CtxState,-1,0x8c2a,this_00);
    ValType = (ViewDesc->Format).ValueType;
    GVar1 = 0x8236;
    if ((pBuffer->super_BufferBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
        .m_Desc.Mode == BUFFER_MODE_FORMATTED || ValType != VT_UNDEFINED) {
      GVar1 = TypeToGLTexFormat(ValType,(uint)(ViewDesc->Format).NumComponents,
                                (ViewDesc->Format).IsNormalized);
    }
    if ((ViewDesc->ByteOffset == 0) &&
       (ViewDesc->ByteWidth ==
        (pBuffer->super_BufferBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
        .m_Desc.Size)) {
      (*__glewTexBuffer)(0x8c2a,GVar1,(pBuffer->m_GlBuffer).m_uiHandle);
    }
    else {
      (*__glewTexBufferRange)
                (0x8c2a,GVar1,(pBuffer->m_GlBuffer).m_uiHandle,ViewDesc->ByteOffset,
                 ViewDesc->ByteWidth);
    }
    local_3c.m_uiHandle = glGetError();
    if (local_3c.m_uiHandle != 0) {
      LogError<true,char[32],char[17],unsigned_int>
                (false,"BufferViewGLImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferViewGLImpl.cpp"
                 ,0x62,(char (*) [32])"Failed to create texture buffer",
                 (char (*) [17])"\nGL Error Code: ",&local_3c.m_uiHandle);
    }
    local_3c.m_uiHandle = 0;
    local_3c.m_CreateReleaseHelper.m_ExternalGLTextureHandle = 0;
    local_3c.m_UniqueId.m_ID = 0;
    GLContextState::BindTexture(CtxState,-1,0x8c2a,&local_3c);
    if (local_3c.m_uiHandle != 0) {
      local_40 = local_3c.m_uiHandle;
      if (local_3c.m_CreateReleaseHelper.m_ExternalGLTextureHandle == 0) {
        glDeleteTextures(1,&local_40);
      }
      else {
        local_3c.m_uiHandle = 0;
        local_3c.m_CreateReleaseHelper.m_ExternalGLTextureHandle = 0;
      }
      local_3c._0_8_ = local_3c._0_8_ & 0xffffffff00000000;
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::SetName
              (this_00,(this->super_BufferViewBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
                       .m_Desc.super_DeviceObjectAttribs.Name);
  }
  return;
}

Assistant:

BufferViewGLImpl::BufferViewGLImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceGLImpl*   pDevice,
                                   GLContextState&       CtxState,
                                   const BufferViewDesc& ViewDesc,
                                   BufferGLImpl*         pBuffer,
                                   bool                  bIsDefaultView) :
    // clang-format off
    TBuffViewBase
    {
        pRefCounters,
        pDevice,
        ViewDesc,
        pBuffer,
        bIsDefaultView
    },
    m_GLTexBuffer{false}
// clang-format on
{
    const auto& BuffDesc = pBuffer->GetDesc();
    if ((ViewDesc.ViewType == BUFFER_VIEW_SHADER_RESOURCE || ViewDesc.ViewType == BUFFER_VIEW_UNORDERED_ACCESS) &&
        (BuffDesc.Mode == BUFFER_MODE_FORMATTED || BuffDesc.Mode == BUFFER_MODE_RAW))
    {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4127) // conditional expression is constant
#endif
        VERIFY(GL_TEXTURE_BUFFER != 0, "GL texture buffers are not supported");
#ifdef _MSC_VER
#    pragma warning(pop)
#endif

        m_GLTexBuffer.Create();
        CtxState.BindTexture(-1, GL_TEXTURE_BUFFER, m_GLTexBuffer);

        const auto& BuffFmt  = ViewDesc.Format;
        GLenum      GLFormat = 0;
        if (BuffDesc.Mode == BUFFER_MODE_FORMATTED || BuffFmt.ValueType != VT_UNDEFINED)
        {
            GLFormat = TypeToGLTexFormat(BuffFmt.ValueType, BuffFmt.NumComponents, BuffFmt.IsNormalized);
        }
        else
        {
            GLFormat = GL_R32UI;
        }

        if (ViewDesc.ByteOffset == 0 && ViewDesc.ByteWidth == BuffDesc.Size)
            glTexBuffer(GL_TEXTURE_BUFFER, GLFormat, pBuffer->GetGLHandle());
        else
        {
#if GL_ARB_texture_buffer_range
            glTexBufferRange(GL_TEXTURE_BUFFER, GLFormat, pBuffer->GetGLHandle(), StaticCast<GLintptr>(ViewDesc.ByteOffset), StaticCast<GLsizeiptr>(ViewDesc.ByteWidth));
#else
            (void)GLFormat;
            LOG_ERROR_AND_THROW("Unable to create view '", ViewDesc.Name, "' for buffer '", BuffDesc.Name,
                                "' because GL_ARB_texture_buffer_range extension is not available. "
                                "Only full-buffer views can be created on this device.");
#endif
        }
        DEV_CHECK_GL_ERROR_AND_THROW("Failed to create texture buffer");

        CtxState.BindTexture(-1, GL_TEXTURE_BUFFER, GLObjectWrappers::GLTextureObj(false));

        m_GLTexBuffer.SetName(m_Desc.Name);
    }
}